

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void accumulate_gop_stats
               (AV1_COMP *cpi,int is_intra_only,int f_w,int f_h,FIRSTPASS_STATS *next_frame,
               FIRSTPASS_STATS *start_pos,GF_GROUP_STATS *gf_stats,int *idx)

{
  double dVar1;
  undefined1 auVar2 [16];
  AV1_PRIMARY *pAVar3;
  FIRSTPASS_STATS *pFVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  uint flash_detected;
  int iVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  
  pAVar3 = cpi->ppi;
  gf_stats->gf_group_skip_pct = 0.0;
  gf_stats->gf_group_inactive_zone_rows = 0.0;
  gf_stats->gf_group_err = 0.0;
  gf_stats->gf_group_raw_error = 0.0;
  gf_stats->mv_ratio_accumulator = 0.0;
  gf_stats->decay_accumulator = 1.0;
  gf_stats->zero_motion_accumulator = 1.0;
  gf_stats->loop_decay_rate = 1.0;
  gf_stats->last_loop_decay_rate = 1.0;
  gf_stats->this_frame_mv_in_out = 0.0;
  gf_stats->mv_in_out_accumulator = 0.0;
  gf_stats->abs_mv_in_out_accumulator = 0.0;
  gf_stats->avg_sr_coded_error = 0.0;
  gf_stats->avg_pcnt_second_ref = 0.0;
  gf_stats->avg_new_mv_count = 0.0;
  gf_stats->avg_wavelet_energy = 0.0;
  gf_stats->avg_raw_err_stdev = 0.0;
  gf_stats->non_zero_stdev_count = 0;
  memset(next_frame,0,0xe8);
  if (is_intra_only < (pAVar3->p_rc).gf_intervals[(pAVar3->p_rc).cur_gf_index]) {
    iVar8 = is_intra_only;
    do {
      pFVar4 = (cpi->twopass_frame).stats_in;
      if (((pAVar3->twopass).stats_buf_ctx)->stats_in_end <= pFVar4) break;
      memcpy(next_frame,pFVar4,0xe8);
      (cpi->twopass_frame).stats_in = (cpi->twopass_frame).stats_in + 1;
      dVar7 = calculate_modified_err_new
                        (&cpi->frame_info,((pAVar3->twopass).stats_buf_ctx)->total_stats,next_frame,
                         (cpi->oxcf).rc_cfg.vbrbias,(pAVar3->twopass).modified_error_min,
                         (pAVar3->twopass).modified_error_max);
      dVar1 = next_frame->coded_error;
      gf_stats->gf_group_err = gf_stats->gf_group_err + dVar7;
      gf_stats->gf_group_raw_error = gf_stats->gf_group_raw_error + dVar1;
      dVar1 = next_frame->inactive_zone_rows;
      gf_stats->gf_group_skip_pct = next_frame->intra_skip_pct + gf_stats->gf_group_skip_pct;
      gf_stats->gf_group_inactive_zone_rows = dVar1 + gf_stats->gf_group_inactive_zone_rows;
      iVar8 = iVar8 + 1;
    } while (iVar8 < (pAVar3->p_rc).gf_intervals[(pAVar3->p_rc).cur_gf_index]);
  }
  (cpi->twopass_frame).stats_in = start_pos;
  if (start_pos < ((pAVar3->twopass).stats_buf_ctx)->stats_in_end) {
    memcpy(next_frame,start_pos,0xe8);
    (cpi->twopass_frame).stats_in = (cpi->twopass_frame).stats_in + 1;
  }
  if (is_intra_only < (pAVar3->p_rc).gf_intervals[(pAVar3->p_rc).cur_gf_index]) {
    do {
      pFVar4 = (cpi->twopass_frame).stats_in;
      if (((pAVar3->twopass).stats_buf_ctx)->stats_in_end <= pFVar4) break;
      memcpy(next_frame,pFVar4,0xe8);
      pFVar4 = (cpi->twopass_frame).stats_in;
      (cpi->twopass_frame).stats_in = pFVar4 + 1;
      flash_detected = 0;
      if ((pFVar4 + 1 < ((pAVar3->twopass).stats_buf_ctx)->stats_in_end) &&
         (dVar1 = pFVar4[1].pcnt_second_ref,
         pFVar4[1].pcnt_inter <= dVar1 && dVar1 != pFVar4[1].pcnt_inter)) {
        flash_detected = (uint)(0.5 <= dVar1);
      }
      accumulate_next_frame_stats
                (next_frame,flash_detected,(cpi->rc).frames_since_key,is_intra_only,gf_stats,f_w,f_h
                );
      is_intra_only = is_intra_only + 1;
    } while (is_intra_only < (pAVar3->p_rc).gf_intervals[(pAVar3->p_rc).cur_gf_index]);
  }
  iVar8 = (pAVar3->p_rc).gf_intervals[(pAVar3->p_rc).cur_gf_index];
  if (iVar8 != 0) {
    dVar1 = (double)iVar8;
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    auVar10._0_8_ = gf_stats->avg_sr_coded_error;
    auVar10._8_8_ = gf_stats->avg_pcnt_second_ref;
    auVar2._0_8_ = gf_stats->avg_new_mv_count;
    auVar2._8_8_ = gf_stats->avg_wavelet_energy;
    auVar5._8_4_ = SUB84(dVar1,0);
    auVar5._0_8_ = dVar1;
    auVar5._12_4_ = uVar9;
    auVar10 = divpd(auVar10,auVar5);
    gf_stats->avg_sr_coded_error = (double)auVar10._0_8_;
    gf_stats->avg_pcnt_second_ref = (double)auVar10._8_8_;
    auVar6._8_4_ = SUB84(dVar1,0);
    auVar6._0_8_ = dVar1;
    auVar6._12_4_ = uVar9;
    auVar10 = divpd(auVar2,auVar6);
    gf_stats->avg_new_mv_count = (double)auVar10._0_8_;
    gf_stats->avg_wavelet_energy = (double)auVar10._8_8_;
  }
  if (gf_stats->non_zero_stdev_count != 0) {
    gf_stats->avg_raw_err_stdev =
         gf_stats->avg_raw_err_stdev / (double)gf_stats->non_zero_stdev_count;
  }
  *idx = iVar8;
  return;
}

Assistant:

static void accumulate_gop_stats(AV1_COMP *cpi, int is_intra_only, int f_w,
                                 int f_h, FIRSTPASS_STATS *next_frame,
                                 const FIRSTPASS_STATS *start_pos,
                                 GF_GROUP_STATS *gf_stats, int *idx) {
  int i, flash_detected;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  RATE_CONTROL *const rc = &cpi->rc;
  FRAME_INFO *frame_info = &cpi->frame_info;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  init_gf_stats(gf_stats);
  av1_zero(*next_frame);

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  i = is_intra_only;
  // get the determined gf group length from p_rc->gf_intervals
  while (i < p_rc->gf_intervals[p_rc->cur_gf_index]) {
    // read in the next frame
    if (EOF == input_stats(twopass, &cpi->twopass_frame, next_frame)) break;
    // Accumulate error score of frames in this gf group.
    double mod_frame_err =
        calculate_modified_err(frame_info, twopass, oxcf, next_frame);
    // accumulate stats for this frame
    accumulate_this_frame_stats(next_frame, mod_frame_err, gf_stats);
    ++i;
  }

  reset_fpf_position(&cpi->twopass_frame, start_pos);

  i = is_intra_only;
  input_stats(twopass, &cpi->twopass_frame, next_frame);
  while (i < p_rc->gf_intervals[p_rc->cur_gf_index]) {
    // read in the next frame
    if (EOF == input_stats(twopass, &cpi->twopass_frame, next_frame)) break;

    // Test for the case where there is a brief flash but the prediction
    // quality back to an earlier frame is then restored.
    flash_detected = detect_flash(twopass, &cpi->twopass_frame, 0);

    // accumulate stats for next frame
    accumulate_next_frame_stats(next_frame, flash_detected,
                                rc->frames_since_key, i, gf_stats, f_w, f_h);

    ++i;
  }

  i = p_rc->gf_intervals[p_rc->cur_gf_index];
  average_gf_stats(i, gf_stats);

  *idx = i;
}